

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O2

void encode_mcu_AC_first_prepare
               (JCOEF *block,int *jpeg_natural_order_start,int Sl,int Al,JCOEF *values,size_t *bits)

{
  short sVar1;
  byte bVar2;
  ushort uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar4 = 0;
  uVar5 = (ulong)(uint)Sl;
  if (Sl < 1) {
    uVar5 = uVar4;
  }
  uVar7 = 0;
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    sVar1 = block[jpeg_natural_order_start[uVar4]];
    uVar8 = (uint)sVar1;
    if (sVar1 != 0) {
      uVar6 = -uVar8;
      if (0 < (int)uVar8) {
        uVar6 = uVar8;
      }
      bVar2 = (byte)Al & 0x1f;
      if (uVar6 >> bVar2 != 0) {
        uVar3 = (ushort)(uVar6 >> bVar2);
        values[uVar4] = uVar3;
        values[uVar4 + 0x40] = sVar1 >> 0xf ^ uVar3;
        uVar7 = uVar7 | 1L << (uVar4 & 0x3f);
      }
    }
  }
  *bits = uVar7;
  return;
}

Assistant:

METHODDEF(void)
encode_mcu_AC_first_prepare(const JCOEF *block,
                            const int *jpeg_natural_order_start, int Sl,
                            int Al, JCOEF *values, size_t *bits)
{
  register int k, temp, temp2;
  size_t zerobits = 0U;
  int Sl0 = Sl;

#if SIZEOF_SIZE_T == 4
  if (Sl0 > 32)
    Sl0 = 32;
#endif

  COMPUTE_ABSVALUES_AC_FIRST(Sl0);

  bits[0] = zerobits;
#if SIZEOF_SIZE_T == 4
  zerobits = 0U;

  if (Sl > 32) {
    Sl -= 32;
    jpeg_natural_order_start += 32;
    values += 32;

    COMPUTE_ABSVALUES_AC_FIRST(Sl);
  }
  bits[1] = zerobits;
#endif
}